

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O0

borg_need borg_maintain_light(void)

{
  borg_item *pbVar1;
  _Bool _Var2;
  wchar_t wVar3;
  int iVar4;
  borg_item *current_light;
  wchar_t i;
  
  pbVar1 = borg_items;
  iVar4 = z_info->pack_size + 5;
  _Var2 = flag_has_dbg(borg_items[iVar4].flags,5,0x15,"current_light->flags","OF_NO_FUEL");
  if (_Var2) {
    current_light._4_4_ = BORG_NO_NEED;
  }
  else if (pbVar1[iVar4].tval == '\x13') {
    if ((uint)pbVar1[iVar4].sval == sv_light_torch) {
      if (pbVar1[iVar4].timeout < 0xfb) {
        wVar3 = borg_slot(L'\x13',sv_light_torch);
        if (wVar3 < L'\0') {
          current_light._4_4_ = BORG_UNMET_NEED;
        }
        else {
          current_light._4_4_ = BORG_NO_NEED;
        }
      }
      else {
        current_light._4_4_ = BORG_NO_NEED;
      }
    }
    else if (((uint)pbVar1[iVar4].sval == sv_light_lantern) &&
            (borg_items[(int)(z_info->pack_size + 5)].timeout < 1000)) {
      _Var2 = borg_refuel_lantern();
      if (_Var2) {
        current_light._4_4_ = BORG_MET_NEED;
      }
      else {
        current_light._4_4_ = BORG_UNMET_NEED;
      }
    }
    else {
      current_light._4_4_ = BORG_NO_NEED;
    }
  }
  else {
    current_light._0_4_ = borg_slot(L'\x13',sv_light_lantern);
    if ((wchar_t)current_light < L'\0') {
      current_light._0_4_ = borg_slot(L'\x13',sv_light_torch);
    }
    if ((wchar_t)current_light < L'\0') {
      current_light._4_4_ = BORG_UNMET_NEED;
    }
    else {
      borg_keypress(0x77);
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[(wchar_t)current_light])
      ;
      current_light._4_4_ = BORG_MET_NEED;
    }
  }
  return current_light._4_4_;
}

Assistant:

enum borg_need borg_maintain_light(void)
{
    int        i;
    borg_item* current_light = &borg_items[INVEN_LIGHT];

    if (of_has(current_light->flags, OF_NO_FUEL))
        return BORG_NO_NEED;

    /*  current torch */
    if (current_light->tval == TV_LIGHT) {
        if (current_light->sval == sv_light_torch) {
            if (current_light->timeout > 250) {
                return BORG_NO_NEED;
            } else {
                /* Look for another torch */
                i = borg_slot(TV_LIGHT, sv_light_torch);
                if (i < 0)
                    return BORG_UNMET_NEED;

                /* Torches automatically disappear when they get to 0 turns
                 * so we don't need to actively swap them out */
                return BORG_NO_NEED;
            }
        }

        /* Refuel current lantern */
        if (current_light->sval == sv_light_lantern) {
            /* Refuel the lantern if needed */
            if (borg_items[INVEN_LIGHT].timeout < 1000) {
                if (borg_refuel_lantern())
                    return BORG_MET_NEED;

                return BORG_UNMET_NEED;
            }
        }
        return BORG_NO_NEED;
    } else {
        i = borg_slot(TV_LIGHT, sv_light_lantern);
        if (i < 0) {
            i = borg_slot(TV_LIGHT, sv_light_torch);
        }

        if (i < 0) {
            return BORG_UNMET_NEED;
        } else {
            borg_keypress('w');
            borg_keypress(all_letters_nohjkl[i]);
            return BORG_MET_NEED;
        }
    }
}